

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int parse_url(char *src_url,int *https,char *host,char *port,char *url)

{
  int iVar1;
  char *pcVar2;
  char local_448 [8];
  char str [1024];
  char *p2;
  char *p1;
  char *url_local;
  char *port_local;
  char *host_local;
  int *https_local;
  char *src_url_local;
  
  memset(local_448,0,0x400);
  iVar1 = strncmp(src_url,"http://",7);
  if (iVar1 == 0) {
    p2 = src_url + 7;
    *https = 0;
  }
  else {
    iVar1 = strncmp(src_url,"https://",8);
    if (iVar1 == 0) {
      p2 = src_url + 8;
      *https = 1;
    }
    else {
      *https = 0;
      p2 = src_url;
    }
  }
  pcVar2 = strstr(p2,"/");
  if (pcVar2 == (char *)0x0) {
    sprintf(local_448,"%s",p2);
    sprintf(url,"/");
  }
  else {
    strncpy(local_448,p2,(long)pcVar2 - (long)p2);
    snprintf(url,0x100,"%s",pcVar2);
  }
  pcVar2 = strstr(local_448,":");
  if (pcVar2 == (char *)0x0) {
    snprintf(host,0x100,"%s",local_448);
    if (*https == 0) {
      snprintf(port,5,"80");
    }
    else {
      snprintf(port,5,"443");
    }
  }
  else {
    *pcVar2 = '\0';
    snprintf(host,0x100,"%s",local_448);
    snprintf(port,5,"%s",pcVar2 + 1);
  }
  return 0;
}

Assistant:

static int parse_url(char *src_url, int *https, char *host, char *port, char *url)
{
    char *p1, *p2;
    char str[1024];

    memset(str, 0, 1024);

    if(strncmp(src_url, "http://", 7)==0) {
        p1=&src_url[7];
        *https = 0;
    } else if(strncmp(src_url, "https://", 8)==0) {
        p1=&src_url[8];
        *https = 1;
    } else {
        p1 = &src_url[0];
        *https = 0;
    }

    if((p2=strstr(p1, "/")) == NULL)
    {
        sprintf(str, "%s", p1);
        sprintf(url, "/");
    }
    else
    {
        strncpy(str, p1, p2-p1);
        snprintf(url, 256, "%s", p2);
    }

    if((p1=strstr(str, ":")) != NULL)
    {
        *p1=0;
        snprintf(host, 256, "%s", str);
        snprintf(port, 5, "%s", p1+1);
    }
    else
    {
        snprintf(host, 256, "%s", str);

        if(*https == 0)
            snprintf(port, 5, "80");
        else
            snprintf(port, 5, "443");
    }

    return 0;

}